

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkLogicMakeSimpleCosTest(Abc_Ntk_t *pNtk,int fDuplicate)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  void **ppvVar4;
  long *plVar5;
  void *__ptr;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int Inputs [2];
  int Consts [2];
  int Counts [4];
  ulong local_38;
  ulong local_30;
  uint local_28 [4];
  
  iVar3 = pNtk->vObjs->nSize;
  __ptr = calloc((long)iVar3,4);
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_30 = 0;
  local_38 = 0;
  lVar6 = (long)pNtk->vCos->nSize;
  if (0 < lVar6) {
    ppvVar4 = pNtk->vCos->pArray;
    lVar8 = 0;
    do {
      plVar5 = (long *)ppvVar4[lVar8];
      lVar9 = (long)*(int *)plVar5[4];
      if (lVar9 == 0) {
        piVar2 = (int *)((long)&local_30 + (ulong)(*(uint *)((long)plVar5 + 0x14) >> 8 & 4));
        *piVar2 = *piVar2 + 1;
      }
      uVar10 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + lVar9 * 8) + 0x14) &
               0xf;
      if ((uVar10 == 2) || (uVar10 == 5)) {
        uVar11 = (ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1);
        piVar2 = (int *)((long)&local_38 + uVar11 * 4);
        *piVar2 = *piVar2 + 1;
      }
      else {
        uVar11 = (ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1);
      }
      puVar1 = (uint *)((long)__ptr + lVar9 * 4);
      *puVar1 = *puVar1 | 1 << (sbyte)uVar11;
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  if (0 < iVar3) {
    sVar7 = 0;
    do {
      local_28[*(uint *)((long)__ptr + sVar7 * 4)] =
           local_28[*(uint *)((long)__ptr + sVar7 * 4)] + 1;
      sVar7 = sVar7 + 1;
    } while ((long)iVar3 != sVar7);
  }
  uVar11 = 0;
  do {
    printf("%d = %d     ",uVar11 & 0xffffffff,(ulong)local_28[uVar11]);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  printf("c%d = %d     ",0,local_30 & 0xffffffff);
  printf("c%d = %d     ",1,local_30 >> 0x20);
  printf("i%d = %d    ",0,local_38 & 0xffffffff);
  printf("i%d = %d    ",1,local_38 >> 0x20);
  putchar(10);
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Abc_NtkLogicMakeSimpleCosTest( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int nObjs = Abc_NtkObjNumMax(pNtk);
    unsigned * pType = ABC_CALLOC( unsigned, nObjs );
    Abc_Obj_t * pNode;
    int i, Counts[4] = {0}, Consts[2] = {0}, Inputs[2] = {0};
    // collect info
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( Abc_ObjFaninId0(pNode) == 0 )
            Consts[Abc_ObjFaninC0(pNode)]++;
        if ( Abc_ObjIsCi(Abc_ObjFanin0(pNode)) )
            Inputs[Abc_ObjFaninC0(pNode)]++;
        pType[Abc_ObjFaninId0(pNode)] |= (1 << Abc_ObjFaninC0(pNode));
    }
    // count the numbers
    for ( i = 0; i < nObjs; i++ )
        Counts[pType[i]]++;
    for ( i = 0; i < 4; i++ )
        printf( "%d = %d     ", i, Counts[i] );
    for ( i = 0; i < 2; i++ )
        printf( "c%d = %d     ", i, Consts[i] );
    for ( i = 0; i < 2; i++ )
        printf( "i%d = %d    ", i, Inputs[i] );
    printf( "\n" );
    ABC_FREE( pType );
}